

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetDoubleValue(MapValueRef *this,double value)

{
  CppType CVar1;
  LogMessage *this_00;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  LogMessage *in_stack_ffffffffffffff50;
  LogLevel in_stack_ffffffffffffff5c;
  LogMessage *in_stack_ffffffffffffff60;
  MapValueRef *in_stack_ffffffffffffffb0;
  
  CVar1 = type(in_stack_ffffffffffffffb0);
  if (CVar1 != CPPTYPE_DOUBLE) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)in_stack_ffffffffffffff50
               ,in_stack_ffffffffffffff4c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    FieldDescriptor::CppTypeName(CPPTYPE_DOUBLE);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    CVar1 = type(in_stack_ffffffffffffffb0);
    FieldDescriptor::CppTypeName(CVar1);
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff50,
                         (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::~LogMessage((LogMessage *)0x6ef969);
  }
  *(undefined8 *)*in_RDI = in_XMM0_Qa;
  return;
}

Assistant:

void SetDoubleValue(double value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_DOUBLE, "MapValueRef::SetDoubleValue");
    *reinterpret_cast<double*>(data_) = value;
  }